

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackResourceValidator::validate
          (TransformFeedbackResourceValidator *this,Program *program,string *resource,
          GLint propValue,string *implementationName)

{
  deBool dVar1;
  ShaderType type;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  path;
  VariableSearchFilter local_30;
  
  dVar1 = deStringBeginsWith((resource->_M_dataplus)._M_p,"gl_");
  if (dVar1 != 0) {
    (*(this->super_PropValidator)._vptr_PropValidator[2])
              (this,resource,(ulong)(uint)propValue,implementationName);
    return;
  }
  path.
  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  path.
  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type = getProgramTransformFeedbackStage(program);
  local_30 = ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeStorageFilter
                       (type,STORAGE_OUT);
  findProgramVariablePathByPathName(&path,program,resource,&local_30);
  (*(this->super_PropValidator)._vptr_PropValidator[3])
            (this,&path,resource,(ulong)(uint)propValue,implementationName);
  std::
  _Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::~_Vector_base(&path.
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 );
  return;
}

Assistant:

void TransformFeedbackResourceValidator::validate (const ProgramInterfaceDefinition::Program* program, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	if (deStringBeginsWith(resource.c_str(), "gl_"))
	{
		validateBuiltinVariable(resource, propValue, implementationName);
	}
	else
	{
		// Check resource name is a xfb output. (sanity check)
#if defined(DE_DEBUG)
		bool generatorFound = false;

		// Check the resource name is a valid transform feedback resource and find the name generating resource
		for (int varyingNdx = 0; varyingNdx < (int)program->getTransformFeedbackVaryings().size(); ++varyingNdx)
		{
			const std::string					varyingName = program->getTransformFeedbackVaryings()[varyingNdx];
			std::vector<VariablePathComponent>	path;
			std::vector<std::string>			resources;

			if (!findProgramVariablePathByPathName(path, program, varyingName, VariableSearchFilter::createShaderTypeStorageFilter(getProgramTransformFeedbackStage(program), glu::STORAGE_OUT)))
			{
				// program does not contain feedback varying, not valid program
				DE_ASSERT(false);
				return;
			}

			generateVariableTypeResourceNames(resources, varyingName, *path.back().getVariableType(), RESOURCE_NAME_GENERATION_FLAG_TRANSFORM_FEEDBACK_VARIABLE);

			if (de::contains(resources.begin(), resources.end(), resource))
			{
				generatorFound = true;
				break;
			}
		}

		// resource name was not found, should never happen
		DE_ASSERT(generatorFound);
		DE_UNREF(generatorFound);
#endif

		// verify resource
		{
			std::vector<VariablePathComponent> path;

			if (!findProgramVariablePathByPathName(path, program, resource, VariableSearchFilter::createShaderTypeStorageFilter(getProgramTransformFeedbackStage(program), glu::STORAGE_OUT)))
				DE_ASSERT(false);

			validateSingleVariable(path, resource, propValue, implementationName);
		}
	}
}